

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

void __thiscall tcmalloc::PageHeap::InsertToFreeList(PageHeap *this,Span *span)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<tcmalloc::Span_*>,_bool> pVar2;
  pair<std::_Rb_tree_const_iterator<tcmalloc::Span_*>,_bool> result_1;
  pair<std::_Rb_tree_const_iterator<tcmalloc::Span_*>,_bool> result;
  Span *span_local;
  PageHeap *this_local;
  
  result._8_8_ = span;
  if (span < (Span *)0x6) {
    __assert_fail("(void*)span > (void*)(0x5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0x162,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
  }
  if (span->location == 0) {
    __assert_fail("span->location != Span::IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                  ,0x163,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
  }
  if (span->npages < 0x80) {
    if (span->location == 1) {
      this->small_normal_size_[span->npages] = this->small_normal_size_[span->npages] + 1;
      (this->stat).small_normal_bytes = span->npages * 0x2000 + (this->stat).small_normal_bytes;
      ListInsert(this->small_normal_ + span->npages,span);
    }
    else {
      this->small_returned_size_[span->npages] = this->small_returned_size_[span->npages] + 1;
      (this->stat).small_returned_bytes = span->npages * 0x2000 + (this->stat).small_returned_bytes;
      ListInsert(this->small_returned_ + span->npages,span);
    }
  }
  else if (span->location == 1) {
    pVar2 = std::
            set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            ::insert(&this->large_normal_,(value_type *)&result.second);
    result.first._M_node._0_1_ = pVar2.second;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("result.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x172,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
    }
    (this->stat).large_normal_bytes =
         *(long *)(result._8_8_ + 0x18) * 0x2000 + (this->stat).large_normal_bytes;
  }
  else {
    pVar2 = std::
            set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            ::insert(&this->large_returned_,(value_type *)&result.second);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("result.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x176,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
    }
    (this->stat).large_returned_bytes =
         *(long *)(result._8_8_ + 0x18) * 0x2000 + (this->stat).large_returned_bytes;
  }
  if (*(long *)(result._8_8_ + 0x40) == 1) {
    (this->stat).normal_bytes = *(long *)(result._8_8_ + 0x18) * 0x2000 + (this->stat).normal_bytes;
  }
  else {
    (this->stat).returned_bytes =
         *(long *)(result._8_8_ + 0x18) * 0x2000 + (this->stat).returned_bytes;
  }
  bVar1 = CheckSmallList(this);
  if (bVar1) {
    return;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                ,0x181,"void tcmalloc::PageHeap::InsertToFreeList(Span *)");
}

Assistant:

void InsertToFreeList(Span* span) {
        assert((void*)span > (void*)(0x5));
        assert(span->location != Span::IN_USE);
        if (span->npages <= spanSmallPages) {
            if (span->location == Span::IN_NORMAL) {
                small_normal_size_[span->npages]++;
                stat.small_normal_bytes += span->npages * spanPageSize;
                ListInsert(&small_normal_[span->npages], span);
            } else {
                small_returned_size_[span->npages]++;
                stat.small_returned_bytes += span->npages * spanPageSize;
                ListInsert(&small_returned_[span->npages], span);
            }
        } else {
            if (span->location == Span::IN_NORMAL) {
                auto result = large_normal_.insert(span);
                // page_id不可能重复
                assert(result.second);
                stat.large_normal_bytes += span->npages * spanPageSize;
            } else {
                auto result = large_returned_.insert(span);
                assert(result.second);
                stat.large_returned_bytes += span->npages * spanPageSize;
            }
        }

        if (span->location == Span::IN_NORMAL) {
            stat.normal_bytes += span->npages * spanPageSize;
        } else {
            stat.returned_bytes += span->npages * spanPageSize;
        }

        assert(CheckSmallList());
    }